

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prob.cpp
# Opt level: O3

double anglit_cdf_inv(double cdf)

{
  double dVar1;
  
  if ((0.0 <= cdf) && (cdf <= 1.0)) {
    dVar1 = acos(1.0 - (cdf + cdf));
    return (dVar1 + -1.5707963267948966) * 0.5;
  }
  std::operator<<((ostream *)&std::cerr,"\n");
  std::operator<<((ostream *)&std::cerr,"ANGLIT_CDF_INV - Fatal error!\n");
  std::operator<<((ostream *)&std::cerr,"  CDF < 0 or 1 < CDF.\n");
  exit(1);
}

Assistant:

double anglit_cdf_inv ( double cdf )

//****************************************************************************80
//
//  Purpose:
//
//    ANGLIT_CDF_INV inverts the Anglit CDF.
//
//  Modified:
//
//    29 December 1999
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, double CDF, the value of the CDF.
//    0.0 <= CDF <= 1.0.
//
//    Output, double ANGLIT_CDF_INV, the corresponding argument.
//
{
  const double r8_pi = 3.14159265358979323;
  double x;

  if ( cdf < 0.0 || 1.0 < cdf )
  {
    cerr << "\n";
    cerr << "ANGLIT_CDF_INV - Fatal error!\n";
    cerr << "  CDF < 0 or 1 < CDF.\n";
    exit ( 1 );
  }

  x = 0.5 * ( acos ( 1.0 - 2.0 * cdf ) - r8_pi / 2.0 );

  return x;
}